

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O0

double __thiscall Benchmark::getDeletionsTime(Benchmark *this,unsigned_long deletions)

{
  type_conflict tVar1;
  bool bVar2;
  iterator __first;
  iterator __last;
  reference peVar3;
  clock_t cVar4;
  long lVar5;
  double elapsed_secs;
  clock_t end;
  unsigned_long local_c0;
  __normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>_>
  local_b8;
  __normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>_>
  local_b0;
  iterator e;
  clock_t begin;
  reference local_90;
  tuples local_78 [16];
  pair<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>_>
  local_68;
  undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
  local_58;
  EdgeIterator ei_end;
  undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
  local_40;
  EdgeIterator ei;
  vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  edges;
  int deletionsCount;
  unsigned_long deletions_local;
  Benchmark *this_local;
  
  edges.
  super__Vector_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::
  vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ::vector((vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
            *)&ei);
  boost::detail::
  undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
  ::undirected_edge_iter(&local_40);
  boost::detail::
  undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
  ::undirected_edge_iter(&local_58);
  local_68 = boost::
             edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>
                       ((undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>
                         *)&this->G);
  boost::tuples::
  tie<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>,boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>>
            (local_78,&local_40,&local_58);
  boost::tuples::
  tuple<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>&,boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>&,boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)local_78,&local_68);
  while( true ) {
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                        *)&local_40,
                       (iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                        *)&local_58);
    if (!tVar1) break;
    boost::iterators::detail::
    iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
    ::operator*(&local_90,
                (iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
                 *)&local_40);
    std::
    vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::push_back((vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                 *)&ei,&local_90);
    edges.
    super__Vector_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         edges.
         super__Vector_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    if ((long)edges.
              super__Vector_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == deletions) break;
    boost::iterators::detail::
    iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
                  *)&local_40);
  }
  __first = std::
            vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
            ::begin((vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                     *)&ei);
  __last = std::
           vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
           ::end((vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                  *)&ei);
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>*,std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>>>
            ((__normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>_>
              )__first._M_current,
             (__normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>_>
              )__last._M_current);
  e._M_current = (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)clock();
  local_b0._M_current =
       (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)
       std::
       vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
       ::begin((vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                *)&ei);
  while( true ) {
    local_b8._M_current =
         (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)
         std::
         vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
         ::end((vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                *)&ei);
    bVar2 = __gnu_cxx::operator!=(&local_b0,&local_b8);
    if (!bVar2) break;
    peVar3 = __gnu_cxx::
             __normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>_>
             ::operator*(&local_b0);
    local_c0 = boost::
               source<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                         (&peVar3->super_edge_base<boost::undirected_tag,_unsigned_long>,
                          &(this->G).super_UndirectedGraph);
    peVar3 = __gnu_cxx::
             __normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>_>
             ::operator*(&local_b0);
    end = boost::
          target<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                    (&peVar3->super_edge_base<boost::undirected_tag,_unsigned_long>,
                     &(this->G).super_UndirectedGraph);
    DynamicGraph::deleteEdge(&this->G,&local_c0,(Vertex *)&end);
    __gnu_cxx::
    __normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>_>
    ::operator++(&local_b0);
  }
  cVar4 = clock();
  lVar5 = cVar4 - (long)e._M_current;
  std::
  vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ::~vector((vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
             *)&ei);
  return (double)lVar5 / 1000000.0;
}

Assistant:

double Benchmark::getDeletionsTime(unsigned long deletions)
{
    int deletionsCount = 0;
    std::vector<Edge> edges;

    // get deletions number of edges
    EdgeIterator ei, ei_end;
    for(boost::tie(ei, ei_end) = boost::edges(G); ei != ei_end; ++ei) {
        edges.push_back(*ei);
        deletionsCount++;
        if (deletionsCount==deletions) {
            break;
        }
    }

    // shuffle them
    std::random_shuffle(edges.begin(), edges.end());

    clock_t begin = clock();
    for(auto e = edges.begin(); e!=edges.end(); ++e) {
        G.deleteEdge(boost::source(*e, G), boost::target(*e, G));
    }
    clock_t end = clock();
    double elapsed_secs = double(end-begin) / CLOCKS_PER_SEC;
    return elapsed_secs;
}